

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

OptionStatus
passLocalOptions(HighsLogOptions *report_log_options,HighsOptions *from_options,
                HighsOptions *to_options)

{
  HighsOptionType HVar1;
  OptionRecordDouble *pOVar2;
  OptionRecordString *pOVar3;
  OptionStatus OVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  string value;
  string local_90 [32];
  string local_70;
  string local_50;
  
  uVar5 = (ulong)((long)(to_options->records).
                        super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(to_options->records).
                       super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar7 = 0;
  uVar6 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    pOVar2 = (OptionRecordDouble *)
             (to_options->records).
             super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
    HVar1 = (pOVar2->super_OptionRecord).type;
    if (HVar1 == kString) {
      std::__cxx11::string::string
                (local_90,(string *)
                          (from_options->records).
                          super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar7][1]._vptr_OptionRecord);
      pOVar3 = (OptionRecordString *)
               (to_options->records).
               super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      std::__cxx11::string::string((string *)&local_50,local_90);
      OVar4 = checkOptionValue(report_log_options,pOVar3,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string(local_90);
joined_r0x0026a916:
      if (OVar4 != kOk) {
        return OVar4;
      }
    }
    else {
      if (HVar1 == kDouble) {
        OVar4 = checkOptionValue(report_log_options,pOVar2,
                                 (double)*(from_options->records).
                                          super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar7][1].
                                          _vptr_OptionRecord);
        goto joined_r0x0026a916;
      }
      if (HVar1 == kInt) {
        OVar4 = checkOptionValue(report_log_options,(OptionRecordInt *)pOVar2,
                                 *(HighsInt *)
                                  (from_options->records).
                                  super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar7][1].
                                  _vptr_OptionRecord);
        goto joined_r0x0026a916;
      }
    }
  }
  uVar5 = 0;
  do {
    if (uVar6 == uVar5) {
      return kOk;
    }
    pOVar2 = (OptionRecordDouble *)
             (to_options->records).
             super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5];
    HVar1 = (pOVar2->super_OptionRecord).type;
    if (HVar1 == kDouble) {
      OVar4 = setLocalOptionValue(report_log_options,pOVar2,
                                  (double)*(from_options->records).
                                           super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar5][1].
                                           _vptr_OptionRecord);
joined_r0x0026a9ca:
      if (OVar4 != kOk) {
        return OVar4;
      }
    }
    else {
      if (HVar1 == kInt) {
        OVar4 = setLocalOptionValue(report_log_options,(OptionRecordInt *)pOVar2,
                                    *(HighsInt *)
                                     (from_options->records).
                                     super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar5][1].
                                     _vptr_OptionRecord);
        goto joined_r0x0026a9ca;
      }
      if (HVar1 != kBool) {
        std::__cxx11::string::string
                  (local_90,(string *)
                            (from_options->records).
                            super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5][1]._vptr_OptionRecord);
        pOVar3 = (OptionRecordString *)
                 (to_options->records).
                 super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
        std::__cxx11::string::string((string *)&local_70,local_90);
        OVar4 = setLocalOptionValue(report_log_options,pOVar3,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string(local_90);
        goto joined_r0x0026a9ca;
      }
      *(undefined1 *)pOVar2->value =
           *(undefined1 *)
            (from_options->records).
            super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5][1]._vptr_OptionRecord;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

OptionStatus passLocalOptions(const HighsLogOptions& report_log_options,
                              const HighsOptions& from_options,
                              HighsOptions& to_options) {
  // (Attempt to) set option value from the HighsOptions passed in
  OptionStatus return_status;
  //  std::string empty_file = "";
  //  std::string from_log_file = from_options.log_file;
  //  std::string original_to_log_file = to_options.log_file;
  //  FILE* original_to_log_stream =
  //  to_options.log_options.log_stream;
  HighsInt num_options = to_options.records.size();
  // Check all the option values before setting any of them - in case
  // to_options are the main Highs options. Checks are only needed for
  // HighsInt, double and string since bool values can't be illegal
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = to_options.records[index]->type;
    if (type == HighsOptionType::kInt) {
      HighsInt value =
          *(((OptionRecordInt*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options, ((OptionRecordInt*)to_options.records[index])[0],
          value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kDouble) {
      double value =
          *(((OptionRecordDouble*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options,
          ((OptionRecordDouble*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kString) {
      std::string value =
          *(((OptionRecordString*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options,
          ((OptionRecordString*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    }
  }
  // Checked from_options and found it to be OK, so set all the values
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = to_options.records[index]->type;
    if (type == HighsOptionType::kBool) {
      bool value = *(((OptionRecordBool*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          ((OptionRecordBool*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kInt) {
      HighsInt value =
          *(((OptionRecordInt*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options, ((OptionRecordInt*)to_options.records[index])[0],
          value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kDouble) {
      double value =
          *(((OptionRecordDouble*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options,
          ((OptionRecordDouble*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else {
      std::string value =
          *(((OptionRecordString*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options,
          ((OptionRecordString*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    }
  }
  /*
  if (from_log_file.compare(original_to_log_file)) {
    // The log file name has changed
    if (from_options.log_options.log_stream &&
        !original_to_log_file.compare(empty_file)) {
      // The stream corresponding to from_log_file is non-null and the
      // original log file name was empty, so to_options inherits the
      // stream, but associated with the (necessarily) non-empty name
      // from_log_file
      //
      // This ensures that the stream to Highs.log opened in
      // RunHighs.cpp is retained unless the log file name is changed.
      assert(from_log_file.compare(empty_file));
      assert(!original_to_log_stream);
      to_options.log_options.log_stream =
          from_options.log_options.log_stream;
    } else {
      highsOpenLogFile(to_options, to_options.log_file);
    }
  }
  */
  return OptionStatus::kOk;
}